

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap_raster.cpp
# Opt level: O3

void __thiscall QRasterPlatformPixmap::resize(QRasterPlatformPixmap *this,int width,int height)

{
  QImage *this_00;
  QImageData *pQVar1;
  bool bVar2;
  Format format;
  int iVar3;
  QRgb QVar4;
  qint64 qVar5;
  long in_FS_OFFSET;
  QImage local_70;
  undefined1 local_58 [16];
  QImageData *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  format = Format_MonoLSB;
  if ((this->super_QPlatformPixmap).type != BitmapType) {
    format = systemNativeFormat();
  }
  QImage::QImage(&local_70,width,height,format);
  this_00 = &this->image;
  local_48 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QPaintDevice::QPaintDevice((QPaintDevice *)local_58);
  pQVar1 = local_70.d;
  local_58._0_8_ = &PTR__QImage_007d1ec8;
  local_70.d = (QImageData *)0x0;
  local_48 = (this->image).d;
  (this->image).d = pQVar1;
  QImage::~QImage((QImage *)local_58);
  QImage::~QImage(&local_70);
  (this->super_QPlatformPixmap).w = width;
  (this->super_QPlatformPixmap).h = height;
  iVar3 = QImage::depth(this_00);
  (this->super_QPlatformPixmap).d = iVar3;
  (this->super_QPlatformPixmap).is_null =
       (this->super_QPlatformPixmap).h < 1 || (this->super_QPlatformPixmap).w < 1;
  if ((this->super_QPlatformPixmap).type == BitmapType) {
    bVar2 = QImage::isNull(this_00);
    if (!bVar2) {
      QImage::setColorCount(this_00,2);
      QColor::QColor((QColor *)local_58,color0);
      QVar4 = QColor::rgba((QColor *)local_58);
      QImage::setColor(this_00,0,QVar4);
      QColor::QColor((QColor *)local_58,color1);
      QVar4 = QColor::rgba((QColor *)local_58);
      QImage::setColor(this_00,1,QVar4);
    }
  }
  qVar5 = QImage::cacheKey(this_00);
  QPlatformPixmap::setSerialNumber(&this->super_QPlatformPixmap,(int)((ulong)qVar5 >> 0x20));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRasterPlatformPixmap::resize(int width, int height)
{
    QImage::Format format;
    if (pixelType() == BitmapType)
        format = QImage::Format_MonoLSB;
    else
        format = systemNativeFormat();

    image = QImage(width, height, format);
    w = width;
    h = height;
    d = image.depth();
    is_null = (w <= 0 || h <= 0);

    if (pixelType() == BitmapType && !image.isNull()) {
        image.setColorCount(2);
        image.setColor(0, QColor(Qt::color0).rgba());
        image.setColor(1, QColor(Qt::color1).rgba());
    }

    setSerialNumber(image.cacheKey() >> 32);
}